

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageLessEqual(StackInterpreter *this)

{
  StackMemory *pSVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  size_t sVar5;
  Oop selector;
  undefined8 *puVar6;
  uint uVar7;
  double dVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  
  pSVar1 = this->stack;
  puVar2 = (ulong *)(pSVar1->stackFrame).stackPointer;
  puVar3 = (ulong *)*puVar2;
  puVar4 = (ulong *)puVar2[1];
  uVar7 = (uint)puVar3;
  uVar9 = (uint)puVar4;
  if ((uVar7 & uVar9 & 1) == 0) {
    if ((uVar7 & 7) == 2 && (uVar9 & 7) == 2) {
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      if ((int)((ulong)puVar4 >> 3) <= (int)((ulong)puVar3 >> 3)) {
LAB_00147bf6:
        puVar6 = &TrueObject;
        goto LAB_00147bfd;
      }
    }
    else {
      if ((((((ulong)puVar4 & 1) == 0) && ((uVar9 & 6) != 4)) &&
          ((((ulong)puVar4 & 6) != 0 || ((uint)(*puVar4 >> 0x2a) != 0x22)))) ||
         (((((ulong)puVar3 & 1) == 0 && ((uVar7 & 6) != 4)) &&
          ((((ulong)puVar3 & 6) != 0 || ((uint)(*puVar3 >> 0x2a) != 0x22)))))) {
        selector = VMContext::getSpecialMessageSelector(this->context,LessEqual);
        sendSelectorArgumentCount(this,selector,1,false);
        return;
      }
      sVar5 = this->pc;
      this->pc = sVar5 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar5);
      (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
      if (((ulong)puVar4 & 1) == 0) {
        uVar9 = uVar9 & 6;
        if (uVar9 != 4) {
          if ((((ulong)puVar4 & 6) != 0) || ((uint)(*puVar4 >> 0x2a) != 0x22)) goto LAB_00147dba;
          if (uVar9 != 4) {
            if ((((ulong)puVar4 & 6) != 0) || ((*puVar4 & 0xfffffc0000000000) != 0x880000000000))
            goto LAB_00147dd9;
            if (uVar9 != 4) {
              dVar11 = (double)puVar4[1];
              goto LAB_00147d27;
            }
          }
        }
        uVar10 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
        dVar11 = (double)(uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f);
      }
      else {
        dVar11 = (double)((long)puVar4 >> 1);
      }
LAB_00147d27:
      if (((ulong)puVar3 & 1) == 0) {
        uVar7 = uVar7 & 6;
        if (uVar7 != 4) {
          if ((((ulong)puVar3 & 6) != 0) || ((uint)(*puVar3 >> 0x2a) != 0x22)) {
LAB_00147dba:
            __assert_fail("isFloatOrInt()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                          ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
          }
          if (uVar7 != 4) {
            if ((((ulong)puVar3 & 6) != 0) || ((*puVar3 & 0xfffffc0000000000) != 0x880000000000)) {
LAB_00147dd9:
              __assert_fail("isFloat()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                            ,0x216,"double Lodtalk::Oop::decodeFloat() const");
            }
            if (uVar7 != 4) {
              dVar8 = (double)puVar3[1];
              goto LAB_00147d9a;
            }
          }
        }
        uVar10 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
        dVar8 = (double)(uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f);
      }
      else {
        dVar8 = (double)((long)puVar3 >> 1);
      }
LAB_00147d9a:
      if (dVar11 <= dVar8) goto LAB_00147bf6;
    }
  }
  else {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    if ((long)puVar4 >> 1 <= (long)puVar3 >> 1) goto LAB_00147bf6;
  }
  puVar6 = &FalseObject;
LAB_00147bfd:
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 1);
  puVar2[1] = (ulong)puVar6;
  return;
}

Assistant:

void interpretSpecialMessageLessEqual()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushBoolean(ia <= ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushBoolean(ca <= cb);
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushBoolean(fa <= fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::LessEqual, 1);
        }
    }